

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O2

void __thiscall ikfast::IkSolution<double>::Validate(IkSolution<double> *this)

{
  double *pdVar1;
  byte bVar2;
  pointer pIVar3;
  runtime_error *this_00;
  uchar *puVar4;
  ulong uVar5;
  
  pIVar3 = (this->_vbasesol).
           super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = pIVar3->indices + 1;
  uVar5 = 0xffffffffffffffff;
  do {
    uVar5 = uVar5 + 1;
    if ((ulong)(((long)(this->_vbasesol).
                       super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3) / 0x18) <= uVar5)
    {
      return;
    }
    bVar2 = puVar4[-2];
    if (bVar2 != 0) {
      if (bVar2 == 0xff) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"max solutions for joint not initialized");
        goto LAB_001149be;
      }
      if (bVar2 <= puVar4[-1]) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"index >= max solutions for joint");
        goto LAB_001149be;
      }
      if (bVar2 <= *puVar4 && *puVar4 != 0xff) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"2nd index >= max solutions for joint");
        goto LAB_001149be;
      }
    }
    pdVar1 = (double *)(puVar4 + -0xc);
    puVar4 = puVar4 + 0x18;
  } while ((ulong)ABS(*pdVar1) < 0x7ff0000000000000);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"foffset was not finite");
LAB_001149be:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual void Validate() const {
        for(size_t i = 0; i < _vbasesol.size(); ++i) {
            if( _vbasesol[i].maxsolutions == (unsigned char)-1) {
                throw std::runtime_error("max solutions for joint not initialized");
            }
            if( _vbasesol[i].maxsolutions > 0 ) {
                if( _vbasesol[i].indices[0] >= _vbasesol[i].maxsolutions ) {
                    throw std::runtime_error("index >= max solutions for joint");
                }
                if( _vbasesol[i].indices[1] != (unsigned char)-1 && _vbasesol[i].indices[1] >= _vbasesol[i].maxsolutions ) {
                    throw std::runtime_error("2nd index >= max solutions for joint");
                }
            }
            if( !std::isfinite(_vbasesol[i].foffset) ) {
                throw std::runtime_error("foffset was not finite");
            }
        }
    }